

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O2

QVariant * __thiscall
QVariantAnimationPrivate::valueAt
          (QVariant *__return_storage_ptr__,QVariantAnimationPrivate *this,qreal step)

{
  const_iterator cVar1;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  pair<double,_QVariant> local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.shared = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  local_48.second.d.data.shared = (PrivateShared *)0x0;
  local_48.second.d.data._8_8_ = 0;
  local_48.second.d.data._16_8_ = 0;
  local_48.second.d._24_8_ = 2;
  local_50 = 2;
  local_48.first = step;
  ::QVariant::~QVariant((QVariant *)&local_68);
  cVar1.i = (this->keyValues).d.ptr;
  cVar1 = std::
          __lower_bound<QList<std::pair<double,QVariant>>::const_iterator,std::pair<double,QVariant>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<double,QVariant>const&,std::pair<double,QVariant>const&)>>
                    (cVar1,cVar1.i + (this->keyValues).d.size,&local_48,
                     (_Iter_comp_val<bool_(*)(const_std::pair<double,_QVariant>_&,_const_std::pair<double,_QVariant>_&)>
                      )0x36d76d);
  if ((cVar1.i == (this->keyValues).d.ptr + (this->keyValues).d.size) ||
     (local_48.first < (cVar1.i)->first)) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    ::QVariant::QVariant(__return_storage_ptr__,&(cVar1.i)->second);
  }
  ::QVariant::~QVariant(&local_48.second);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QVariantAnimationPrivate::valueAt(qreal step) const
{
    const auto sought = std::pair{step, QVariant()};
    const auto result = std::lower_bound(keyValues.cbegin(), keyValues.cend(), sought,
                                         animationValueLessThan);
    if (result != keyValues.cend() && !animationValueLessThan(sought, *result))
        return result->second;

    return QVariant();
}